

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_impl.hpp
# Opt level: O1

void __thiscall
xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge::PrintEdge(Edge *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Edge_t: src - ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , dst - ",9);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , cost - ",10);
  poVar1 = std::ostream::_M_insert<double>(this->cost);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::Edge::PrintEdge() {
  std::cout << "Edge_t: src - " << src->GetVertexID() << " , dst - "
            << dst->GetVertexID() << " , cost - " << cost << std::endl;
}